

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

int __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::GetCachedSize(MapEntryImpl<CoreML::Specification::MILSpec::Program_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  
  uVar2 = this->_has_bits_[0];
  iVar3 = 0;
  iVar1 = 0;
  if ((uVar2 & 1) != 0) {
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])(this);
    sVar4 = WireFormatLite::StringSize((string *)CONCAT44(extraout_var,iVar1));
    iVar1 = (int)sVar4 + 1;
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 2) != 0) {
    iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
    iVar3 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Value>
            ::GetCachedSize((MapEntryAccessorType *)CONCAT44(extraout_var_00,iVar3));
    iVar3 = iVar3 + 1;
  }
  return iVar3 + iVar1;
}

Assistant:

int GetCachedSize() const override {
    int size = 0;
    size += has_key() ? static_cast<int>(kTagSize) +
                            KeyTypeHandler::GetCachedSize(key())
                      : 0;
    size += has_value() ? static_cast<int>(kTagSize) +
                              ValueTypeHandler::GetCachedSize(value())
                        : 0;
    return size;
  }